

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testharness.h
# Opt level: O2

Tester * __thiscall leveldb::test::Tester::Is(Tester *this,bool b,char *msg)

{
  ostream *poVar1;
  undefined7 in_register_00000031;
  
  if ((int)CONCAT71(in_register_00000031,b) == 0) {
    poVar1 = std::operator<<((ostream *)&this->field_0x28," Assertion failure ");
    std::operator<<(poVar1,msg);
    this->ok_ = false;
  }
  return this;
}

Assistant:

Tester& Is(bool b, const char* msg) {
    if (!b) {
      ss_ << " Assertion failure " << msg;
      ok_ = false;
    }
    return *this;
  }